

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

int disas_neon_ls_insn(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *s_00;
  TCGContext_conflict1 *s_01;
  uintptr_t o_8;
  TCGTemp *pTVar1;
  TCGv_i64 val;
  TCGTemp *pTVar2;
  TCGv_i32 pTVar3;
  sbyte sVar4;
  uint uVar5;
  uint32_t oprsz;
  uint uVar6;
  int32_t arg2;
  uint uVar7;
  uintptr_t o_6;
  ulong uVar8;
  MemOp MVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint reg;
  uint uVar13;
  uintptr_t o_3;
  MemOp MVar14;
  TCGv_i32 pTVar15;
  ulong uVar16;
  uint32_t dofs;
  MemOp MVar17;
  TCGArg a3;
  ARMMMUIdx local_a8;
  uint local_84;
  int local_60;
  uint local_5c;
  
  if (s->fp_excp_el != 0) {
    gen_exception_insn(s,(uint32_t)s->pc_curr,1,0x1fe00020,s->fp_excp_el);
    return 0;
  }
  if (s->vfp_enabled != true) {
    return 1;
  }
  s_00 = s->uc->tcg_ctx;
  if ((s->isar->mvfr0 & 0xe) == 0) {
    if ((insn >> 0x16 & 1) != 0) {
      return 1;
    }
    local_5c = insn >> 0xc & 0xf;
  }
  else {
    local_5c = insn >> 0x12 & 0x10 | insn >> 0xc & 0xf;
  }
  uVar8 = (ulong)local_5c;
  reg = insn >> 0x10 & 0xf;
  if ((insn >> 0x17 & 1) == 0) {
    uVar5 = insn >> 8 & 0xf;
    if (10 < uVar5) {
      return 1;
    }
    MVar9 = s->be_data;
    local_a8 = s->mmu_idx;
    uVar6 = insn >> 8 & 0xc;
    if (uVar6 == 8) {
      if ((~insn & 0x30) == 0) {
        return 1;
      }
    }
    else if ((uVar6 == 4) && ((insn & 0x20) != 0)) {
      return 1;
    }
    MVar14 = insn >> 6 & MO_64;
    iVar12 = neon_ls_element_type[uVar5].nregs;
    uVar6 = neon_ls_element_type[uVar5].interleave;
    uVar5 = neon_ls_element_type[uVar5].spacing;
    if ((MVar14 == MO_64) && ((uVar5 | uVar6) != 1)) {
      return 1;
    }
    if (MVar14 == MO_8) {
      MVar9 = MO_8;
    }
    MVar17 = MO_64;
    if (uVar6 != 1 || MVar9 != MO_8) {
      MVar17 = MVar14;
    }
    local_60 = 0;
    pTVar1 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
    val = (TCGv_i64)((long)pTVar1 - (long)s_00);
    pTVar2 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
    pTVar15 = (TCGv_i32)((long)pTVar2 - (long)s_00);
    sVar4 = (sbyte)MVar17;
    pTVar3 = tcg_const_i32_aarch64(s_00,1 << sVar4);
    load_reg_var(s,pTVar15,reg);
    if (0 < iVar12) {
      local_a8 = local_a8 & 0xf;
      local_5c = local_5c * 8;
      do {
        local_84 = 0;
        do {
          if (0 < (int)uVar6) {
            uVar16 = uVar8;
            uVar13 = local_5c;
            uVar7 = uVar6;
            do {
              a3 = (ulong)((local_84 << sVar4) + (uVar13 & 8) + 0xc10) +
                   (ulong)((uint)(uVar16 >> 1) & 0x3fffffff) * 0x100;
              if ((insn >> 0x15 & 1) == 0) {
                tcg_gen_op3_aarch64(s_00,MVar17 * 2 + INDEX_op_ld8u_i64,(TCGArg)pTVar1,
                                    (TCGArg)(s_00->cpu_env + (long)s_00),a3);
                gen_aa32_st_i64(s,val,pTVar15,local_a8,MVar9 | MVar17);
              }
              else {
                gen_aa32_ld_i64(s,val,pTVar15,local_a8,MVar9 | MVar17);
                tcg_gen_op3_aarch64(s_00,MVar17 + (MO_ALIGN_16|MO_BEUL),(TCGArg)pTVar1,
                                    (TCGArg)(s_00->cpu_env + (long)s_00),a3);
              }
              tcg_gen_op3_aarch64(s_00,INDEX_op_add_i32,(TCGArg)pTVar2,(TCGArg)pTVar2,
                                  (TCGArg)(pTVar3 + (long)&s_00->pool_cur));
              uVar13 = uVar13 + uVar5 * 8;
              uVar16 = (ulong)((int)uVar16 + uVar5);
              uVar7 = uVar7 - 1;
            } while (uVar7 != 0);
          }
          local_84 = local_84 + 1;
        } while (local_84 != 8U >> sVar4);
        local_60 = local_60 + 1;
        local_5c = local_5c + 8;
        uVar8 = (ulong)((int)uVar8 + 1);
      } while (local_60 != iVar12);
    }
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar15 + (long)s_00));
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar3 + (long)s_00));
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(val + (long)s_00));
    arg2 = iVar12 * uVar6 * 8;
    goto LAB_00646341;
  }
  MVar9 = insn >> 10 & MO_64;
  uVar5 = insn >> 4;
  switch(MVar9) {
  case MO_8:
    uVar6 = insn >> 5 & 7;
    iVar10 = 1;
    uVar13 = insn >> 8 & 3;
    iVar12 = uVar13 + 1;
    switch(uVar13) {
    case 0:
      goto switchD_00645bc3_caseD_0;
    case 2:
switchD_00645bc3_caseD_2:
      if ((insn & 0x10) != 0) {
        return 1;
      }
    case 1:
switchD_00645bc3_caseD_1:
      if ((insn & 0x20) != 0 && MVar9 == MO_32) {
        return 1;
      }
      break;
    case 3:
switchD_00645bc3_caseD_3:
      if ((~insn & 0x30) == 0 && MVar9 == MO_32) {
        return 1;
      }
    }
    goto LAB_00645e8b;
  case MO_16:
    uVar6 = insn >> 6 & 3;
    iVar10 = 2 - (uint)((insn & 0x20) == 0);
    uVar13 = insn >> 8 & 3;
    iVar12 = uVar13 + 1;
    switch(uVar13) {
    case 1:
      goto switchD_00645bc3_caseD_1;
    case 2:
      goto switchD_00645bc3_caseD_2;
    case 3:
      goto switchD_00645bc3_caseD_3;
    }
    break;
  case MO_32:
    uVar6 = insn >> 7 & 1;
    iVar10 = 2 - (uint)((insn & 0x40) == 0);
    uVar13 = insn >> 8 & 3;
    iVar12 = uVar13 + 1;
    switch(uVar13) {
    case 1:
      goto switchD_00645bc3_caseD_1;
    case 2:
      goto switchD_00645bc3_caseD_2;
    case 3:
      goto switchD_00645bc3_caseD_3;
    }
    break;
  case MO_64:
    if ((insn >> 0x15 & 1) == 0) {
      return 1;
    }
    MVar9 = insn >> 6 & MO_64;
    uVar6 = insn >> 8 & 3;
    iVar12 = uVar6 + 1;
    if ((MVar9 == MO_64) && (MVar9 = MO_32, (uVar5 & 1) == 0 || iVar12 != 4)) {
      return 1;
    }
    if (((uVar5 & 1) != 0) && (MVar9 == MO_8 && uVar6 == 0 || iVar12 == 3)) {
      return 1;
    }
    pTVar1 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
    pTVar3 = (TCGv_i32)((long)pTVar1 - (long)s_00);
    load_reg_var(s,pTVar3,reg);
    iVar10 = 2 - (uint)((insn & 0x20) == 0);
    oprsz = 8;
    if (uVar6 == 0) {
      oprsz = iVar10 * 8;
    }
    pTVar1 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
    pTVar15 = (TCGv_i32)((long)pTVar1 - (long)s_00);
    uVar5 = local_5c * 8;
    local_5c = local_5c << 7;
    iVar11 = iVar12;
    do {
      gen_aa32_ld_i32(s,pTVar15,pTVar3,s->mmu_idx & 0xf,s->be_data | MVar9);
      if (((uVar8 & 1) == 0) || (oprsz != 0x10)) {
        tcg_gen_gvec_dup_i32_aarch64
                  (s_00,MVar9,(local_5c & 0xffffff00) + (uVar5 & 8) + 0xc10,oprsz,oprsz,pTVar15);
      }
      else {
        dofs = (local_5c & 0xffffff00) + 0xc18;
        tcg_gen_gvec_dup_i32_aarch64(s_00,MVar9,dofs,8,8,pTVar15);
        tcg_gen_gvec_mov_aarch64(s_00,0,local_5c + 0xc90,dofs,8,8);
      }
      tcg_gen_addi_i32_aarch64(s_00,pTVar3,pTVar3,1 << (sbyte)MVar9);
      uVar8 = (ulong)(uint)((int)uVar8 + iVar10);
      uVar5 = uVar5 + iVar10 * 8;
      local_5c = local_5c + iVar10 * 0x80;
      iVar11 = iVar11 + -1;
    } while (iVar11 != 0);
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar15 + (long)s_00));
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar3 + (long)s_00));
    arg2 = iVar12 << (sbyte)MVar9;
    goto LAB_00646341;
  }
switchD_00645bc3_caseD_0:
  if ((uVar5 >> MVar9 & 1) != 0) {
    return 1;
  }
  if ((MVar9 == MO_32) && ((uVar5 & 3) - 1 < 2)) {
    return 1;
  }
LAB_00645e8b:
  if (0x1f < iVar10 * uVar13 + local_5c) {
    return 1;
  }
  pTVar1 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
  pTVar3 = (TCGv_i32)((long)pTVar1 - (long)s_00);
  pTVar2 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
  pTVar15 = (TCGv_i32)((long)pTVar2 - (long)s_00);
  load_reg_var(s,pTVar15,reg);
  sVar4 = (sbyte)MVar9;
  local_5c = local_5c * 8;
  iVar11 = uVar13 + 1;
  do {
    if ((insn >> 0x15 & 1) == 0) {
      tcg_gen_op3_aarch64(s_00,MVar9 * 2 + INDEX_op_ld8u_i32,(TCGArg)pTVar1,
                          (TCGArg)(s_00->cpu_env + (long)s_00),
                          (uVar8 >> 1) * 0x100 + (ulong)(uVar6 << sVar4) + (ulong)(local_5c & 8) +
                          0xc10);
      gen_aa32_st_i32(s,pTVar3,pTVar15,s->mmu_idx & 0xf,s->be_data | MVar9);
    }
    else {
      gen_aa32_ld_i32(s,pTVar3,pTVar15,s->mmu_idx & 0xf,s->be_data | MVar9);
      tcg_gen_op3_aarch64(s_00,MVar9 + MO_BESL,(TCGArg)pTVar1,(TCGArg)(s_00->cpu_env + (long)s_00),
                          (uVar8 >> 1) * 0x100 + (ulong)(uVar6 << sVar4) + (ulong)(local_5c & 8) +
                          0xc10);
    }
    uVar8 = (ulong)(uint)((int)uVar8 + iVar10);
    tcg_gen_addi_i32_aarch64(s_00,pTVar15,pTVar15,1 << sVar4);
    local_5c = local_5c + iVar10 * 8;
    iVar11 = iVar11 + -1;
  } while (iVar11 != 0);
  tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar15 + (long)s_00));
  tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar3 + (long)s_00));
  arg2 = iVar12 << sVar4;
LAB_00646341:
  uVar5 = insn & 0xf;
  if (uVar5 != 0xf) {
    s_01 = s->uc->tcg_ctx;
    pTVar1 = tcg_temp_new_internal_aarch64(s_01,TCG_TYPE_I32,false);
    pTVar3 = (TCGv_i32)((long)pTVar1 - (long)s_01);
    load_reg_var(s,pTVar3,reg);
    if (uVar5 == 0xd) {
      tcg_gen_addi_i32_aarch64(s_00,pTVar3,pTVar3,arg2);
    }
    else {
      pTVar15 = load_reg(s,uVar5);
      tcg_gen_op3_aarch64(s_00,INDEX_op_add_i32,(TCGArg)(pTVar3 + (long)s_00),
                          (TCGArg)(pTVar3 + (long)s_00),(TCGArg)(pTVar15 + (long)s_00));
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar15 + (long)s_00));
    }
    store_reg(s,reg,pTVar3);
    return 0;
  }
  return 0;
}

Assistant:

static int disas_neon_ls_insn(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int rd, rn, rm;
    int op;
    int nregs;
    int interleave;
    int spacing;
    int stride;
    int size;
    int reg;
    int load;
    int n;
    int vec_size;
    int mmu_idx;
    MemOp endian;
    TCGv_i32 addr;
    TCGv_i32 tmp;
    TCGv_i32 tmp2;
    TCGv_i64 tmp64;

    /* FIXME: this access check should not take precedence over UNDEF
     * for invalid encodings; we will generate incorrect syndrome information
     * for attempts to execute invalid vfp/neon encodings with FP disabled.
     */
    if (s->fp_excp_el) {
        gen_exception_insn(s, s->pc_curr, EXCP_UDEF,
                           syn_simd_access_trap(1, 0xe, false), s->fp_excp_el);
        return 0;
    }

    if (!s->vfp_enabled)
      return 1;
    VFP_DREG_D(rd, insn);
    rn = (insn >> 16) & 0xf;
    rm = insn & 0xf;
    load = (insn & (1 << 21)) != 0;
    endian = s->be_data;
    mmu_idx = get_mem_index(s);
    if ((insn & (1 << 23)) == 0) {
        /* Load store all elements.  */
        op = (insn >> 8) & 0xf;
        size = (insn >> 6) & 3;
        if (op > 10)
            return 1;
        /* Catch UNDEF cases for bad values of align field */
        switch (op & 0xc) {
        case 4:
            if (((insn >> 5) & 1) == 1) {
                return 1;
            }
            break;
        case 8:
            if (((insn >> 4) & 3) == 3) {
                return 1;
            }
            break;
        default:
            break;
        }
        nregs = neon_ls_element_type[op].nregs;
        interleave = neon_ls_element_type[op].interleave;
        spacing = neon_ls_element_type[op].spacing;
        if (size == 3 && (interleave | spacing) != 1) {
            return 1;
        }
        /* For our purposes, bytes are always little-endian.  */
        if (size == 0) {
            endian = MO_LE;
        }
        /* Consecutive little-endian elements from a single register
         * can be promoted to a larger little-endian operation.
         */
        if (interleave == 1 && endian == MO_LE) {
            size = 3;
        }
        tmp64 = tcg_temp_new_i64(tcg_ctx);
        addr = tcg_temp_new_i32(tcg_ctx);
        tmp2 = tcg_const_i32(tcg_ctx, 1 << size);
        load_reg_var(s, addr, rn);
        for (reg = 0; reg < nregs; reg++) {
            for (n = 0; n < 8 >> size; n++) {
                int xs;
                for (xs = 0; xs < interleave; xs++) {
                    int tt = rd + reg + spacing * xs;

                    if (load) {
                        gen_aa32_ld_i64(s, tmp64, addr, mmu_idx, endian | size);
                        neon_store_element64(tcg_ctx, tt, n, size, tmp64);
                    } else {
                        neon_load_element64(tcg_ctx, tmp64, tt, n, size);
                        gen_aa32_st_i64(s, tmp64, addr, mmu_idx, endian | size);
                    }
                    tcg_gen_add_i32(tcg_ctx, addr, addr, tmp2);
                }
            }
        }
        tcg_temp_free_i32(tcg_ctx, addr);
        tcg_temp_free_i32(tcg_ctx, tmp2);
        tcg_temp_free_i64(tcg_ctx, tmp64);
        stride = nregs * interleave * 8;
    } else {
        size = (insn >> 10) & 3;
        if (size == 3) {
            /* Load single element to all lanes.  */
            int a = (insn >> 4) & 1;
            if (!load) {
                return 1;
            }
            size = (insn >> 6) & 3;
            nregs = ((insn >> 8) & 3) + 1;

            if (size == 3) {
                if (nregs != 4 || a == 0) {
                    return 1;
                }
                /* For VLD4 size==3 a == 1 means 32 bits at 16 byte alignment */
                size = 2;
            }
            if (nregs == 1 && a == 1 && size == 0) {
                return 1;
            }
            if (nregs == 3 && a == 1) {
                return 1;
            }
            addr = tcg_temp_new_i32(tcg_ctx);
            load_reg_var(s, addr, rn);

            /* VLD1 to all lanes: bit 5 indicates how many Dregs to write.
             * VLD2/3/4 to all lanes: bit 5 indicates register stride.
             */
            stride = (insn & (1 << 5)) ? 2 : 1;
            vec_size = nregs == 1 ? stride * 8 : 8;

            tmp = tcg_temp_new_i32(tcg_ctx);
            for (reg = 0; reg < nregs; reg++) {
                gen_aa32_ld_i32(s, tmp, addr, get_mem_index(s),
                                s->be_data | size);
                if ((rd & 1) && vec_size == 16) {
                    /* We cannot write 16 bytes at once because the
                     * destination is unaligned.
                     */
                    tcg_gen_gvec_dup_i32(tcg_ctx, size, neon_reg_offset(rd, 0),
                                         8, 8, tmp);
                    tcg_gen_gvec_mov(tcg_ctx, 0, neon_reg_offset(rd + 1, 0),
                                     neon_reg_offset(rd, 0), 8, 8);
                } else {
                    tcg_gen_gvec_dup_i32(tcg_ctx, size, neon_reg_offset(rd, 0),
                                         vec_size, vec_size, tmp);
                }
                tcg_gen_addi_i32(tcg_ctx, addr, addr, 1 << size);
                rd += stride;
            }
            tcg_temp_free_i32(tcg_ctx, tmp);
            tcg_temp_free_i32(tcg_ctx, addr);
            stride = (1 << size) * nregs;
        } else {
            /* Single element.  */
            int idx = (insn >> 4) & 0xf;
            int reg_idx;
            switch (size) {
            case 0:
                reg_idx = (insn >> 5) & 7;
                stride = 1;
                break;
            case 1:
                reg_idx = (insn >> 6) & 3;
                stride = (insn & (1 << 5)) ? 2 : 1;
                break;
            case 2:
                reg_idx = (insn >> 7) & 1;
                stride = (insn & (1 << 6)) ? 2 : 1;
                break;
            default:
                abort();
            }
            nregs = ((insn >> 8) & 3) + 1;
            /* Catch the UNDEF cases. This is unavoidably a bit messy. */
            switch (nregs) {
            case 1:
                if (((idx & (1 << size)) != 0) ||
                    (size == 2 && ((idx & 3) == 1 || (idx & 3) == 2))) {
                    return 1;
                }
                break;
            case 3:
                if ((idx & 1) != 0) {
                    return 1;
                }
                /* fall through */
            case 2:
                if (size == 2 && (idx & 2) != 0) {
                    return 1;
                }
                break;
            case 4:
                if ((size == 2) && ((idx & 3) == 3)) {
                    return 1;
                }
                break;
            default:
                abort();
            }
            if ((rd + stride * (nregs - 1)) > 31) {
                /* Attempts to write off the end of the register file
                 * are UNPREDICTABLE; we choose to UNDEF because otherwise
                 * the neon_load_reg() would write off the end of the array.
                 */
                return 1;
            }
            tmp = tcg_temp_new_i32(tcg_ctx);
            addr = tcg_temp_new_i32(tcg_ctx);
            load_reg_var(s, addr, rn);
            for (reg = 0; reg < nregs; reg++) {
                if (load) {
                    gen_aa32_ld_i32(s, tmp, addr, get_mem_index(s),
                                    s->be_data | size);
                    neon_store_element(tcg_ctx, rd, reg_idx, size, tmp);
                } else { /* Store */
                    neon_load_element(tcg_ctx, tmp, rd, reg_idx, size);
                    gen_aa32_st_i32(s, tmp, addr, get_mem_index(s),
                                    s->be_data | size);
                }
                rd += stride;
                tcg_gen_addi_i32(tcg_ctx, addr, addr, 1 << size);
            }
            tcg_temp_free_i32(tcg_ctx, addr);
            tcg_temp_free_i32(tcg_ctx, tmp);
            stride = nregs * (1 << size);
        }
    }
    if (rm != 15) {
        TCGv_i32 base;

        base = load_reg(s, rn);
        if (rm == 13) {
            tcg_gen_addi_i32(tcg_ctx, base, base, stride);
        } else {
            TCGv_i32 index;
            index = load_reg(s, rm);
            tcg_gen_add_i32(tcg_ctx, base, base, index);
            tcg_temp_free_i32(tcg_ctx, index);
        }
        store_reg(s, rn, base);
    }
    return 0;
}